

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_inlines_b.h
# Opt level: O1

void arena_dalloc_no_tcache(tsdn_t *tsdn,void *ptr)

{
  rtree_ctx_cache_elm_t *prVar1;
  undefined8 *puVar2;
  rtree_leaf_elm_t *prVar3;
  rtree_leaf_elm_t *prVar4;
  ulong uVar5;
  rtree_leaf_elm_t *prVar6;
  ulong uVar7;
  rtree_ctx_cache_elm_t *prVar8;
  rtree_ctx_cache_elm_t *prVar9;
  rtree_leaf_elm_t *prVar10;
  uint uVar11;
  rtree_ctx_t *prVar12;
  bool bVar13;
  rtree_ctx_t rtree_ctx_fallback;
  rtree_ctx_t rStack_328;
  rtree_ctx_t local_1a8;
  
  prVar12 = &rStack_328;
  if (tsdn == (tsdn_t *)0x0) {
    rtree_ctx_data_init(&rStack_328);
  }
  else {
    prVar12 = &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  uVar11 = (uint)((ulong)ptr >> 0x1e) & 0xf;
  prVar10 = (rtree_leaf_elm_t *)((ulong)ptr & 0xffffffffc0000000);
  uVar5 = (ulong)(uVar11 << 4);
  puVar2 = (undefined8 *)((long)&prVar12->cache[0].leafkey + uVar5);
  prVar6 = *(rtree_leaf_elm_t **)((long)&prVar12->cache[0].leafkey + uVar5);
  if (prVar6 == prVar10) {
    prVar6 = (rtree_leaf_elm_t *)((ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8) + puVar2[1]);
  }
  else if ((rtree_leaf_elm_t *)prVar12->l2_cache[0].leafkey == prVar10) {
    prVar3 = prVar12->l2_cache[0].leaf;
    prVar12->l2_cache[0].leafkey = (uintptr_t)prVar6;
    prVar12->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar2[1];
    *puVar2 = prVar10;
    puVar2[1] = prVar3;
    prVar6 = (rtree_leaf_elm_t *)
             ((long)&(prVar3->le_bits).repr + (ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8));
  }
  else {
    prVar8 = prVar12->l2_cache + 1;
    if ((rtree_leaf_elm_t *)prVar12->l2_cache[1].leafkey == prVar10) {
      uVar7 = 0;
      bVar13 = false;
    }
    else {
      uVar5 = 1;
      prVar9 = prVar8;
      do {
        uVar7 = uVar5;
        bVar13 = 6 < uVar7;
        if (uVar7 == 7) goto LAB_0014c442;
        prVar8 = prVar9 + 1;
        prVar1 = prVar9 + 1;
        uVar5 = uVar7 + 1;
        prVar9 = prVar8;
      } while ((rtree_leaf_elm_t *)prVar1->leafkey != prVar10);
      bVar13 = 6 < uVar7;
    }
    prVar3 = prVar8->leaf;
    prVar8->leafkey = prVar12->l2_cache[uVar7].leafkey;
    prVar8->leaf = prVar12->l2_cache[uVar7].leaf;
    prVar12->l2_cache[uVar7].leafkey = (uintptr_t)prVar6;
    prVar12->l2_cache[uVar7].leaf = (rtree_leaf_elm_t *)puVar2[1];
    *puVar2 = prVar10;
    puVar2[1] = prVar3;
    prVar6 = (rtree_leaf_elm_t *)
             ((long)&(prVar3->le_bits).repr + (ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8));
LAB_0014c442:
    if (bVar13) {
      prVar6 = rtree_leaf_elm_lookup_hard(tsdn,&extents_rtree,prVar12,(uintptr_t)ptr,true,false);
    }
  }
  if (((ulong)(prVar6->le_bits).repr & 1) == 0) {
    if (tsdn == (tsdn_t *)0x0) {
      prVar12 = &local_1a8;
      rtree_ctx_data_init(prVar12);
    }
    else {
      prVar12 = &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
    }
    uVar5 = (ulong)(uVar11 << 4);
    prVar6 = (rtree_leaf_elm_t *)((long)&prVar12->cache[0].leafkey + uVar5);
    prVar3 = *(rtree_leaf_elm_t **)((long)&prVar12->cache[0].leafkey + uVar5);
    if (prVar3 == prVar10) {
      prVar6 = (rtree_leaf_elm_t *)
               ((ulong)((uint)ptr >> 9 & 0x1ffff8) + (long)prVar6[1].le_bits.repr);
    }
    else if ((rtree_leaf_elm_t *)prVar12->l2_cache[0].leafkey == prVar10) {
      prVar4 = prVar12->l2_cache[0].leaf;
      prVar12->l2_cache[0].leafkey = (uintptr_t)prVar3;
      prVar12->l2_cache[0].leaf = (rtree_leaf_elm_t *)prVar6[1].le_bits.repr;
      (prVar6->le_bits).repr = prVar10;
      prVar6[1].le_bits.repr = prVar4;
      prVar6 = (rtree_leaf_elm_t *)
               ((long)&(prVar4->le_bits).repr + (ulong)((uint)ptr >> 9 & 0x1ffff8));
    }
    else {
      prVar8 = prVar12->l2_cache + 1;
      if ((rtree_leaf_elm_t *)prVar12->l2_cache[1].leafkey == prVar10) {
        uVar7 = 0;
        bVar13 = false;
      }
      else {
        uVar5 = 1;
        prVar9 = prVar8;
        do {
          uVar7 = uVar5;
          bVar13 = 6 < uVar7;
          if (uVar7 == 7) goto LAB_0014c546;
          prVar8 = prVar9 + 1;
          prVar1 = prVar9 + 1;
          uVar5 = uVar7 + 1;
          prVar9 = prVar8;
        } while ((rtree_leaf_elm_t *)prVar1->leafkey != prVar10);
        bVar13 = 6 < uVar7;
      }
      prVar4 = prVar8->leaf;
      prVar8->leafkey = prVar12->l2_cache[uVar7].leafkey;
      prVar8->leaf = prVar12->l2_cache[uVar7].leaf;
      prVar12->l2_cache[uVar7].leafkey = (uintptr_t)prVar3;
      prVar12->l2_cache[uVar7].leaf = (rtree_leaf_elm_t *)prVar6[1].le_bits.repr;
      (prVar6->le_bits).repr = prVar10;
      prVar6[1].le_bits.repr = prVar4;
      prVar6 = (rtree_leaf_elm_t *)
               ((long)&(prVar4->le_bits).repr + (ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8));
LAB_0014c546:
      if (bVar13) {
        prVar6 = rtree_leaf_elm_lookup_hard(tsdn,&extents_rtree,prVar12,(uintptr_t)ptr,true,false);
      }
    }
    large_dalloc(tsdn,(extent_t *)
                      (((long)(prVar6->le_bits).repr << 0x10) >> 0x10 & 0xfffffffffffffffe));
  }
  else {
    arena_dalloc_small(tsdn,ptr);
  }
  return;
}

Assistant:

static inline void
arena_dalloc_no_tcache(tsdn_t *tsdn, void *ptr) {
	assert(ptr != NULL);

	rtree_ctx_t rtree_ctx_fallback;
	rtree_ctx_t *rtree_ctx = tsdn_rtree_ctx(tsdn, &rtree_ctx_fallback);

	szind_t szind;
	bool slab;
	rtree_szind_slab_read(tsdn, &extents_rtree, rtree_ctx, (uintptr_t)ptr,
	    true, &szind, &slab);

	if (config_debug) {
		extent_t *extent = rtree_extent_read(tsdn, &extents_rtree,
		    rtree_ctx, (uintptr_t)ptr, true);
		assert(szind == extent_szind_get(extent));
		assert(szind < SC_NSIZES);
		assert(slab == extent_slab_get(extent));
	}

	if (likely(slab)) {
		/* Small allocation. */
		arena_dalloc_small(tsdn, ptr);
	} else {
		extent_t *extent = iealloc(tsdn, ptr);
		large_dalloc(tsdn, extent);
	}
}